

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

bool __thiscall bssl::TemporaryFile::Init(TemporaryFile *this,Span<const_unsigned_char> content)

{
  int __fd;
  size_t sVar1;
  bool bVar2;
  char *__s;
  ScopedFILE file;
  string path;
  string temp_dir;
  
  GetTempDir_abi_cxx11_();
  if (temp_dir._M_string_length == 0) {
    bVar2 = false;
    goto LAB_003a24d4;
  }
  std::operator+(&path,&temp_dir,"bssl_tmp_file.XXXXXX");
  __fd = mkstemp(path._M_dataplus._M_p);
  if (__fd < 0) {
    perror("Could not create temporary file");
    bVar2 = false;
  }
  else {
    close(__fd);
    std::__cxx11::string::operator=((string *)this,(string *)&path);
    Open((TemporaryFile *)&file,(char *)this);
    if ((__uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>)
        file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
        super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.
        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>)0x0) {
      __s = "Could not open temporary file";
LAB_003a250d:
      perror(__s);
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (content.size_ != 0) {
        sVar1 = fwrite(content.data_,content.size_,1,
                       (FILE *)file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
                               super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.
                               super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
        if (sVar1 != 1) {
          __s = "Could not write temporary file";
          goto LAB_003a250d;
        }
      }
    }
    std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::~unique_ptr(&file);
  }
  std::__cxx11::string::~string((string *)&path);
LAB_003a24d4:
  std::__cxx11::string::~string((string *)&temp_dir);
  return bVar2;
}

Assistant:

bool TemporaryFile::Init(bssl::Span<const uint8_t> content) {
  std::string temp_dir = GetTempDir();
  if (temp_dir.empty()) {
    return false;
  }

#if defined(OPENSSL_WINDOWS)
  char path[MAX_PATH];
  if (GetTempFileNameA(temp_dir.c_str(), "bssl",
                       /*uUnique=*/0, path) == 0) {
    PrintLastError("Could not create temporary");
    return false;
  }
  path_ = path;
#else
  std::string path = temp_dir + "bssl_tmp_file.XXXXXX";
  int fd = mkstemp(path.data());
  if (fd < 0) {
    perror("Could not create temporary file");
    return false;
  }
  close(fd);
  path_ = std::move(path);
#endif

  ScopedFILE file = Open("wb");
  if (file == nullptr) {
    perror("Could not open temporary file");
    return false;
  }
  if (!content.empty() &&
      fwrite(content.data(), content.size(), /*nitems=*/1, file.get()) != 1) {
    perror("Could not write temporary file");
    return false;
  }
  return true;
}